

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_0::ReverseKeyComparator::FindShortestSeparator
          (ReverseKeyComparator *this,string *start,Slice *limit)

{
  Comparator *pCVar1;
  Slice local_c0;
  Slice local_b0 [2];
  Slice local_90 [2];
  undefined1 local_70 [8];
  string l;
  Slice local_50;
  undefined1 local_40 [8];
  string s;
  Slice *limit_local;
  string *start_local;
  ReverseKeyComparator *this_local;
  
  Slice::Slice(&local_50,start);
  Reverse_abi_cxx11_((Slice *)local_40);
  Reverse_abi_cxx11_((Slice *)local_70);
  pCVar1 = BytewiseComparator();
  Slice::Slice(local_90,(string *)local_70);
  (*pCVar1->_vptr_Comparator[4])(pCVar1,local_40,local_90);
  Slice::Slice(&local_c0,(string *)local_40);
  Reverse_abi_cxx11_(local_b0);
  std::__cxx11::string::operator=((string *)start,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    std::string s = Reverse(*start);
    std::string l = Reverse(limit);
    BytewiseComparator()->FindShortestSeparator(&s, l);
    *start = Reverse(s);
  }